

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

void file_size_symbol(t_file_handle *x,t_symbol *filename)

{
  int iVar1;
  uint uVar2;
  _outlet *x_00;
  t_float f;
  stat_conflict sb;
  stat_conflict sStack_98;
  
  iVar1 = do_file_stat(x,filename->s_name,&sStack_98,(int *)0x0);
  if (-1 < iVar1) {
    uVar2 = sStack_98.st_mode & 0xf000;
    if ((short)uVar2 == 0x4000) {
      x_00 = x->x_dataout;
      f = 0.0;
    }
    else if ((uVar2 == 0xa000) || (uVar2 == 0x8000)) {
      f = (t_float)(int)sStack_98.st_size;
      x_00 = x->x_dataout;
    }
    else {
      x_00 = x->x_dataout;
      f = -1.0;
    }
    outlet_float(x_00,f);
    return;
  }
  outlet_bang(x->x_infoout);
  return;
}

Assistant:

static void file_size_symbol(t_file_handle*x, t_symbol*filename) {
    struct stat sb;
    if(do_file_stat(x, filename->s_name, &sb, 0) < 0) {
        outlet_bang(x->x_infoout);
    } else {
        switch (sb.st_mode & S_IFMT) {
        case S_IFREG:
#ifdef S_IFLNK
        case S_IFLNK:
#endif
            outlet_float(x->x_dataout, (int)(sb.st_size));
            break;
        case S_IFDIR:
            outlet_float(x->x_dataout, 0);
            break;
        default:
            outlet_float(x->x_dataout, -1);
            break;
        }
    }
}